

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O0

bool __thiscall QHttpHeaders::contains(QHttpHeaders *this,QAnyStringView name)

{
  QAnyStringView name_00;
  bool bVar1;
  const_iterator __last;
  const_iterator __pred;
  size_t in_RDX;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RSI;
  const_iterator in_RDI;
  long in_FS_OFFSET;
  HeaderName *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  bool local_49;
  HeaderName local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isEmpty((QHttpHeaders *)0x1c77da);
  if (bVar1) {
    local_49 = false;
  }
  else {
    QExplicitlySharedDataPointer<QHttpHeadersPrivate>::operator->
              ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)0x1c77f4);
    __last = QList<Header>::cbegin
                       ((QList<Header> *)
                        CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    QExplicitlySharedDataPointer<QHttpHeadersPrivate>::operator->
              ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)0x1c780f);
    __pred = QList<Header>::cend((QList<Header> *)
                                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    name_00.m_size = in_RDX;
    name_00.field_0.m_data = in_RSI.m_data;
    HeaderName::HeaderName(in_stack_ffffffffffffff78,name_00);
    headerNameMatches(&local_28);
    local_49 = std::any_of<QList<Header>::const_iterator,headerNameMatches(HeaderName_const&)::__0>
                         (in_RDI,__last,(anon_class_8_1_898f2789_for__M_pred)__pred.i);
    HeaderName::~HeaderName((HeaderName *)0x1c787b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_49;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpHeaders::contains(QAnyStringView name) const
{
    if (isEmpty())
        return false;

    return std::any_of(d->headers.cbegin(), d->headers.cend(), headerNameMatches(HeaderName{name}));
}